

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::on_bin
          (int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  uint uVar2;
  basic_format_specs<wchar_t> *pbVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  format_specs local_d8;
  ulong local_a8;
  ulong uStack_a0;
  wchar_t local_98 [2];
  wchar_t awStack_90 [6];
  padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::bin_writer<1>_>
  local_78;
  
  pbVar3 = this->specs;
  if ((char)pbVar3->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = pbVar3->type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  local_78.f.abs_value._0_8_ = (ulong)this->abs_value;
  local_78.f.abs_value._8_8_ = *(ulong *)((long)&this->abs_value + 8);
  lVar6 = 0;
  uVar7 = local_78.f.abs_value._8_8_;
  uVar8 = (ulong)local_78.f.abs_value;
  do {
    uVar4 = uVar7 << 0x3f;
    lVar6 = lVar6 + 1;
    bVar9 = 1 < uVar8;
    bVar10 = uVar7 != 0;
    uVar5 = -uVar7;
    uVar7 = uVar7 >> 1;
    uVar8 = uVar4 | uVar8 >> 1;
  } while (bVar10 || uVar5 < bVar9);
  local_78.prefix.size_ = (size_t)this->prefix_size;
  local_d8._32_8_ = *(undefined8 *)((pbVar3->fill).data_ + 5);
  local_d8.width = pbVar3->width;
  local_d8.precision = pbVar3->precision;
  uStack_a0._0_1_ = pbVar3->type;
  uStack_a0._1_3_ = *(undefined3 *)&pbVar3->field_0x9;
  uStack_a0._4_4_ = (pbVar3->fill).data_[0];
  local_d8.fill.data_._4_8_ = *(undefined8 *)((pbVar3->fill).data_ + 1);
  local_d8.fill.data_._12_8_ = *(undefined8 *)((pbVar3->fill).data_ + 3);
  local_78.size_ = local_78.prefix.size_ + lVar6;
  local_d8._9_1_ = SUB31(uStack_a0._1_3_,0);
  local_78.f.num_digits = (int)lVar6;
  local_78.fill = uStack_a0._4_4_;
  if ((local_d8._9_1_ & 0xf) == 4) {
    uVar7 = local_d8._0_8_ & 0xffffffff;
    local_78.padding = 0;
    if (local_78.size_ <= uVar7) {
      local_78.padding = uVar7 - local_78.size_;
      local_78.size_ = uVar7;
    }
  }
  else if (local_78.f.num_digits < (int)local_d8.precision) {
    local_78.padding = (ulong)(uint)(local_d8.precision - local_78.f.num_digits);
    local_78.size_ = (uint)local_d8.precision + local_78.prefix.size_;
    local_78.fill = L'0';
  }
  else {
    local_78.padding = 0;
  }
  local_d8._8_8_ = uStack_a0;
  if ((uStack_a0 & 0xf00) == 0) {
    local_d8._8_8_ = uStack_a0 | 0x200;
  }
  local_78.prefix.data_ = this->prefix;
  local_a8 = local_d8._0_8_;
  local_98 = (wchar_t  [2])local_d8.fill.data_._4_8_;
  awStack_90._0_8_ = local_d8.fill.data_._12_8_;
  awStack_90._8_8_ = local_d8._32_8_;
  basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
  write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,duckdb_fmt::v6::basic_format_specs<wchar_t>>::bin_writer<1>>>
            ((basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *)this->writer,&local_d8,&local_78
            );
  return;
}

Assistant:

void on_bin() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(specs.type);
      }
      int num_digits = count_digits<1>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<1>{abs_value, num_digits});
    }